

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O0

int is_frame_resize_pending(AV1_COMP *cpi)

{
  bool local_12;
  bool local_11;
  ResizePendingParams *resize_pending_params;
  AV1_COMP *cpi_local;
  
  local_11 = false;
  if (((cpi->resize_pending_params).width != 0) &&
     (local_11 = false, (cpi->resize_pending_params).height != 0)) {
    local_12 = true;
    if ((cpi->common).width == (cpi->resize_pending_params).width) {
      local_12 = (cpi->common).height != (cpi->resize_pending_params).height;
    }
    local_11 = local_12;
  }
  return (int)local_11;
}

Assistant:

static inline int is_frame_resize_pending(const AV1_COMP *const cpi) {
  const ResizePendingParams *const resize_pending_params =
      &cpi->resize_pending_params;
  return (resize_pending_params->width && resize_pending_params->height &&
          (cpi->common.width != resize_pending_params->width ||
           cpi->common.height != resize_pending_params->height));
}